

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Stress::anon_unknown_0::DrawInvalidRangeCase::init
          (DrawInvalidRangeCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  deUint32 dVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  ProgramSources *pPVar4;
  TestError *this_01;
  int ndx;
  long lVar5;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  string local_188;
  string local_168;
  undefined1 local_148 [40];
  undefined1 local_120 [40];
  ProgramSources local_f8;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,(long)this->m_bufferedElements,(allocator_type *)&local_f8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&indices,(long)this->m_numIndices,(allocator_type *)&local_f8);
  for (lVar5 = 0; lVar5 < this->m_numIndices; lVar5 = lVar5 + 1) {
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5] = (uint)lVar5;
  }
  (**(code **)(lVar3 + 0x6c8))(1,&this->m_buffer);
  (**(code **)(lVar3 + 0x40))(0x8892,this->m_buffer);
  (**(code **)(lVar3 + 0x150))
            (0x8892,(long)(this->m_bufferedElements << 4),
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"buffer gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0x78);
  (**(code **)(lVar3 + 0x6c8))(1,&this->m_indexBuffer);
  (**(code **)(lVar3 + 0x40))(0x8893,this->m_indexBuffer);
  (**(code **)(lVar3 + 0x150))
            (0x8893,(long)(this->m_numIndices << 2),
             indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"buffer gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0x7d);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_f8,0,0xac);
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_1b9);
  glu::VertexSource::VertexSource((VertexSource *)local_148,&local_168);
  pPVar4 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
             ,&local_1ba);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_120,&local_188);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_120);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar4);
  this->m_program = this_00;
  std::__cxx11::string::~string((string *)(local_120 + 8));
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)(local_148 + 8));
  std::__cxx11::string::~string((string *)&local_168);
  glu::ProgramSources::~ProgramSources(&local_f8);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    return extraout_EAX;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"could not build program",(allocator<char> *)local_148);
  tcu::TestError::TestError(this_01,(string *)&local_f8);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DrawInvalidRangeCase::init (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	std::vector<tcu::Vec4>	data	(m_bufferedElements); // !< some junk data to make sure buffer is really allocated
	std::vector<deUint32>	indices	(m_numIndices);

	for (int ndx = 0; ndx < m_numIndices; ++ndx)
		indices[ndx] = ndx;

	gl.genBuffers(1, &m_buffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer);
	gl.bufferData(GL_ARRAY_BUFFER, int(m_bufferedElements * sizeof(tcu::Vec4)), &data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "buffer gen");

	gl.genBuffers(1, &m_indexBuffer);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, int(m_numIndices * sizeof(deUint32)), &indices[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "buffer gen");

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_vertexSource) << glu::FragmentSource(s_fragmentSource));
	if (!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;
		throw tcu::TestError("could not build program");
	}
}